

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O2

void __thiscall gvr::CameraCollection::loadCamera(CameraCollection *this,char *file)

{
  bool bVar1;
  long lVar2;
  PinholeCamera *this_00;
  allocator local_371;
  double t;
  double dmin;
  double doffs;
  Properties prop;
  double dmax;
  Properties mprop;
  string s;
  string name;
  allocator local_2b0 [32];
  Matrix33d A;
  PinholeCamera cam0;
  string local_240 [272];
  PinholeCamera cam1;
  undefined8 local_128;
  undefined8 uStack_120;
  
  std::__cxx11::string::string((string *)&name,file,(allocator *)&cam0);
  lVar2 = std::__cxx11::string::find_last_of((char *)&name,0x126a9c);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&cam0,(ulong)&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&cam0);
    std::__cxx11::string::~string((string *)&cam0);
  }
  bVar1 = std::operator==(&name,"calib.txt");
  if (bVar1) {
    gutil::Properties::Properties(&mprop,file);
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    gmath::SMatrix<double,_3,_3>::SMatrix(&A);
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>(&mprop,"cam0",&A,(char *)0x0);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(&prop,"camera.A",&A);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    gutil::Properties::getString((char *)&mprop,(string *)0x126be5,(char *)&s);
    gutil::Properties::putString((char *)&prop,(string *)"camera.width");
    gutil::Properties::getString((char *)&mprop,(string *)0x126bf2,(char *)&s);
    gutil::Properties::putString((char *)&prop,(string *)"camera.height");
    gutil::Properties::putValue<double>(&prop,"f",(double *)&A);
    gutil::Properties::getValue<double>(&mprop,"baseline",&t,(char *)0x0);
    gutil::Properties::putValue<double>(&prop,"t",&t);
    std::__cxx11::string::string((string *)&cam0,"[1 0 0; 0 1 0; 0 0 1]",(allocator *)&cam1);
    gutil::Properties::putString((char *)&prop,(string *)"camera.R");
    std::__cxx11::string::~string((string *)&cam0);
    gutil::Properties::putValue<char[8]>(&prop,"camera.T",(char (*) [8])"[0 0 0]");
    gutil::Properties::getValue<double>(&mprop,"doffs",&doffs,"0");
    gutil::Properties::getValue<double>(&mprop,"vmin",&dmin,"0");
    gutil::Properties::getValue<double>(&mprop,"vmax",&dmax,"0");
    if ((0.0 < dmin) && (0.0 < dmax)) {
      _cam0 = (A.v[0][0] * t) / (dmax + doffs);
      gutil::Properties::putValue<double>(&prop,"camera.zmin",(double *)&cam0);
      _cam0 = (A.v[0][0] * t) / (dmin + doffs);
      gutil::Properties::putValue<double>(&prop,"camera.zmax",(double *)&cam0);
    }
    std::__cxx11::string::string((string *)&cam0,"cam0, cam1",(allocator *)&cam1);
    gutil::Properties::putString((char *)&prop,(string *)"camera.match");
    std::__cxx11::string::~string((string *)&cam0);
    gmath::PinholeCamera::PinholeCamera(&cam0,&prop,-1);
    std::__cxx11::string::string((string *)&cam1,"cam0",local_2b0);
    std::__cxx11::string::_M_assign(local_240);
    std::__cxx11::string::~string((string *)&cam1);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,&cam0);
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>(&mprop,"cam1",&A,(char *)0x0);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(&prop,"camera.A",&A);
    _cam1 = t;
    local_128 = 0;
    uStack_120 = 0;
    gutil::Properties::putValue<gmath::SVector<double,3>>
              (&prop,"camera.T",(SVector<double,_3> *)&cam1);
    gmath::PinholeCamera::PinholeCamera(&cam1,&prop,-1);
    std::__cxx11::string::string((string *)local_2b0,"cam1",&local_371);
    std::__cxx11::string::_M_assign((string *)&local_128);
    std::__cxx11::string::~string((string *)local_2b0);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,&cam1);
    gmath::PinholeCamera::~PinholeCamera(&cam1);
    gmath::PinholeCamera::~PinholeCamera(&cam0);
    std::__cxx11::string::~string((string *)&s);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&prop);
    this_00 = (PinholeCamera *)&mprop;
  }
  else {
    gutil::Properties::Properties((Properties *)&cam1,file);
    gmath::PinholeCamera::PinholeCamera(&cam0,(Properties *)&cam1,-1);
    std::__cxx11::string::_M_assign(local_240);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,&cam0);
    gmath::PinholeCamera::~PinholeCamera(&cam0);
    this_00 = &cam1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CameraCollection::loadCamera(const char *file)
{
  std::string name=file;

  size_t i=name.find_last_of("/\\");

  if (i != name.npos)
  {
    name=name.substr(i+1);
  }

  if (name == "calib.txt")
  {
    // conversion of pinhole camera parameters from Middlebury format

    gutil::Properties mprop(file), prop;

    gmath::Matrix33d A;
    mprop.getValue("cam0", A);
    prop.putValue("camera.A", A);

    std::string s;
    mprop.getString("width", s, "0");
    prop.putString("camera.width", s);
    mprop.getString("height", s, "0");
    prop.putString("camera.height", s);

    prop.putValue("f", A(0, 0));

    double t;
    mprop.getValue("baseline", t);
    prop.putValue("t", t);

    prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");
    prop.putValue("camera.T", "[0 0 0]");

    double doffs, dmin, dmax;

    mprop.getValue("doffs", doffs, "0");
    mprop.getValue("vmin", dmin, "0");
    mprop.getValue("vmax", dmax, "0");

    if (dmin > 0 && dmax > 0)
    {
      prop.putValue("camera.zmin", A(0, 0)*t/(dmax+doffs));
      prop.putValue("camera.zmax", A(0, 0)*t/(dmin+doffs));
    }

    prop.putString("camera.match", "cam0, cam1");

    gmath::PinholeCamera cam0(prop);
    cam0.setName("cam0");
    cl.push_back(cam0);

    mprop.getValue("cam1", A);
    prop.putValue("camera.A", A);
    prop.putValue("camera.T", gmath::Vector3d(t, 0, 0));

    gmath::PinholeCamera cam1(prop);
    cam1.setName("cam1");
    cl.push_back(cam1);
  }
  else
  {
    // load text file as pinhole camera and store in list

    gutil::Properties prop(file);
    gmath::PinholeCamera cam(prop);
    cam.setName(name);

    // add camera model

    cl.push_back(cam);
  }
}